

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osqp++_test.cc
# Opt level: O3

void __thiscall
osqp::anon_unknown_0::TwoDimensionalQpTest_SolvesWithNewObjectiveVector_Test::TestBody
          (TwoDimensionalQpTest_SolvesWithNewObjectiveVector_Test *this)

{
  OsqpExitCode OVar1;
  Matrix<double,__1,_1,_0,__1,_1> *pMVar2;
  undefined8 *puVar3;
  char *pcVar4;
  OsqpSolver *objective_vector_00;
  variable_if_dynamic<long,__1> __ptr_00;
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  char *message;
  char *in_R9;
  pointer *__ptr;
  Span<const_double> expected;
  VectorXd objective_vector;
  char *in_stack_ffffffffffffff78;
  OsqpExitCode in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_70;
  _Alloc_hider _Var5;
  variable_if_dynamic<long,__1> vStack_60;
  undefined8 abs_error;
  undefined8 uVar6;
  double val1;
  AssertHelper local_40;
  Matrix<double,__1,_1,_0,__1,_1> local_38;
  Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> local_28;
  
  local_38.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0x0;
  local_38.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
  pMVar2 = (Matrix<double,__1,_1,_0,__1,_1> *)malloc(0x10);
  if (((ulong)pMVar2 & 0xf) != 0) {
    __assert_fail("(size<16 || (std::size_t(result)%16)==0) && \"System\'s malloc returned an unaligned pointer. Compile with EIGEN_MALLOC_ALREADY_ALIGNED=0 to fallback to handmade aligned memory allocator.\""
                  ,"/usr/include/eigen3/Eigen/src/Core/util/Memory.h",0xb9,
                  "void *Eigen::internal::aligned_malloc(std::size_t)");
  }
  if (pMVar2 == (Matrix<double,__1,_1,_0,__1,_1> *)0x0) {
    puVar3 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar3 = execv;
    __cxa_throw(puVar3,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  _Var5._M_p = (pointer)&local_38;
  local_38.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 2;
  vStack_60.m_value = 0;
  abs_error = 4.94065645841247e-324;
  uVar6 = 1;
  (pMVar2->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data =
       (double *)0x3ff0000000000000;
  local_78._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_38.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)pMVar2;
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
            ((CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&stack0xffffffffffffff98,
             (Scalar *)&local_78);
  if ((uVar6 + vStack_60.m_value != *(long *)(_Var5._M_p + 8)) ||
     ((double)abs_error != 4.94065645841247e-324)) {
    __assert_fail("((m_row+m_currentBlockRows) == m_xpr.rows() || m_xpr.cols() == 0) && m_col == m_xpr.cols() && \"Too few coefficients passed to comma initializer (operator<<)\""
                  ,"/usr/include/eigen3/Eigen/src/Core/CommaInitializer.h",0x7c,
                  "XprType &Eigen::CommaInitializer<Eigen::Matrix<double, -1, 1>>::finished() [MatrixType = Eigen::Matrix<double, -1, 1>]"
                 );
  }
  uVar6 = (void *)0x0;
  val1 = 0.0;
  vStack_60.m_value =
       local_38.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
  if (local_38.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows < 0
      && (Matrix<double,__1,_1,_0,__1,_1> *)
         local_38.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data !=
         (Matrix<double,__1,_1,_0,__1,_1> *)0x0) {
    __assert_fail("(dataPtr == 0) || ( rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols))"
                  ,"/usr/include/eigen3/Eigen/src/Core/MapBase.h",0xb2,
                  "Eigen::MapBase<Eigen::Ref<const Eigen::Matrix<double, -1, 1>>>::MapBase(PointerType, Index, Index) [Derived = Eigen::Ref<const Eigen::Matrix<double, -1, 1>>, Level = 0]"
                 );
  }
  objective_vector_00 = &(this->super_TwoDimensionalQpTest).solver_;
  _Var5._M_p = (pointer)local_38.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                        m_storage.m_data;
  OsqpSolver::SetObjectiveVector
            ((OsqpSolver *)&stack0xffffffffffffff80,
             (Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_> *)
             objective_vector_00);
  local_78._M_head_impl._0_1_ =
       (internal)
       ((StatusRep *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80) ==
       (StatusRep *)0x1);
  local_70 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if ((in_stack_ffffffffffffff80 & kPrimalInfeasible) == kOptimal) {
    absl::status_internal::StatusRep::Unref
              ((StatusRep *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
  }
  this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_70;
  free((void *)uVar6);
  if (local_78._M_head_impl._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&stack0xffffffffffffff80);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&stack0xffffffffffffff98,(internal *)&local_78,
               (AssertionResult *)"solver_.SetObjectiveVector(objective_vector).ok()","false","true"
               ,in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]osqp-cpp/test/osqp++_test.cc"
               ,0x171,_Var5._M_p);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&stack0xffffffffffffff80);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if ((Matrix<double,__1,_1,_0,__1,_1> *)_Var5._M_p !=
        (Matrix<double,__1,_1,_0,__1,_1> *)&stack0xffffffffffffffa8) {
      operator_delete(_Var5._M_p,abs_error + 1);
    }
    if ((long *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80) + 8))();
    }
    __ptr_00.m_value = (long)local_70;
    if (local_70 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    goto LAB_00120cab;
  }
  else {
    if (local_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()(this_00,local_70);
    }
    OVar1 = OsqpSolver::Solve(objective_vector_00);
    local_78._M_head_impl._0_4_ = OVar1;
    OVar1 = kOptimal;
    testing::internal::CmpHelperEQ<osqp::OsqpExitCode,osqp::OsqpExitCode>
              ((internal *)&stack0xffffffffffffff98,"solver_.Solve()","OsqpExitCode::kOptimal",
               (OsqpExitCode *)&local_78,(OsqpExitCode *)&stack0xffffffffffffff80);
    if (SUB81(_Var5._M_p,0) != (internal)0x0) {
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)vStack_60.m_value !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&vStack_60,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     vStack_60.m_value);
      }
      OsqpSolver::objective_value(objective_vector_00);
      pcVar4 = "3 * kTolerance";
      testing::internal::DoubleNearPredFormat
                ((char *)CONCAT44(in_stack_ffffffffffffff84,OVar1),in_stack_ffffffffffffff78,
                 _Var5._M_p,val1,(double)uVar6,(double)abs_error);
      if (SUB81(_Var5._M_p,0) == (internal)0x0) {
        testing::Message::Message((Message *)&local_78);
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)vStack_60.m_value
            == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          message = "";
        }
        else {
          message = *(char **)vStack_60.m_value;
        }
        pcVar4 = (char *)0x175;
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&stack0xffffffffffffff80,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]osqp-cpp/test/osqp++_test.cc"
                   ,0x175,message);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&stack0xffffffffffffff80,(Message *)&local_78);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffff80);
        if (local_78._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_78._M_head_impl + 8))();
        }
      }
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)vStack_60.m_value !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&vStack_60,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     vStack_60.m_value);
      }
      OsqpSolver::primal_solution(&local_28,objective_vector_00);
      vStack_60.m_value = -0x4030000000000000;
      expected.len_ = (size_type)pcVar4;
      expected.ptr_ = (pointer)0x2;
      ExpectElementsAre((anon_unknown_0 *)&local_28,
                        (Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>
                         *)&stack0xffffffffffffff98,expected,1e-05);
      goto LAB_00120cab;
    }
    testing::Message::Message((Message *)&local_78);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)vStack_60.m_value ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)vStack_60.m_value;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xffffffffffffff80,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]osqp-cpp/test/osqp++_test.cc"
               ,0x172,pcVar4);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&stack0xffffffffffffff80,(Message *)&local_78);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffff80);
    if (local_78._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_78._M_head_impl + 8))();
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)vStack_60.m_value ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) goto LAB_00120cab;
    this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&vStack_60;
    __ptr_00.m_value = vStack_60.m_value;
  }
  std::
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  operator()(this_00,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     __ptr_00.m_value);
LAB_00120cab:
  free(local_38.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  return;
}

Assistant:

TEST_F(TwoDimensionalQpTest, SolvesWithNewObjectiveVector) {
  // Changes the objective to x^2 + (1/2)xy + y^2 + x
  VectorXd objective_vector(2);
  objective_vector << 1.0, 0.0;
  ASSERT_TRUE(solver_.SetObjectiveVector(objective_vector).ok());
  ASSERT_EQ(solver_.Solve(), OsqpExitCode::kOptimal);

  EXPECT_NEAR(solver_.objective_value(), 1.0 - 0.5 * 0.25 + 0.25 * 0.25 + 1.0,
              3 * kTolerance);
  ExpectElementsAre(solver_.primal_solution(), {1.0, -0.25}, kTolerance);
}